

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint32_t *puVar4;
  long lVar5;
  uint uVar6;
  
  if (keybits == 0x80) {
    iVar2 = 10;
  }
  else if (keybits == 0x100) {
    iVar2 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar2 = 0xc;
  }
  ctx->nr = iVar2;
  puVar4 = ctx->buf;
  ctx->rk_offset = 0;
  if (0x1f < keybits) {
    uVar3 = 0;
    do {
      puVar4[uVar3] = *(uint32_t *)(key + uVar3 * 4);
      uVar3 = uVar3 + 1;
    } while (keybits >> 5 != uVar3);
  }
  iVar2 = ctx->nr;
  if (iVar2 == 10) {
    lVar5 = 0;
    do {
      uVar1 = ctx->buf[lVar5 + 3];
      uVar6 = (uint)FSb[uVar1 & 0xff] << 0x18 ^ (uint)FSb[uVar1 >> 0x18] << 0x10 ^
              (uint)FSb[uVar1 >> 0x10 & 0xff] << 8 ^
              (uint)FSb[uVar1 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar5) ^ puVar4[lVar5];
      ctx->buf[lVar5 + 4] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 + 1];
      ctx->buf[lVar5 + 5] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 + 2];
      ctx->buf[lVar5 + 6] = uVar6;
      ctx->buf[lVar5 + 7] = uVar6 ^ uVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x28);
  }
  else if (iVar2 == 0xc) {
    lVar5 = 0;
    do {
      uVar1 = puVar4[5];
      uVar6 = (uint)FSb[uVar1 & 0xff] << 0x18 ^ (uint)FSb[uVar1 >> 0x18] << 0x10 ^
              (uint)FSb[uVar1 >> 0x10 & 0xff] << 8 ^
              (uint)FSb[uVar1 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar5) ^ *puVar4;
      puVar4[6] = uVar6;
      uVar6 = uVar6 ^ puVar4[1];
      puVar4[7] = uVar6;
      uVar6 = uVar6 ^ puVar4[2];
      puVar4[8] = uVar6;
      uVar6 = uVar6 ^ puVar4[3];
      puVar4[9] = uVar6;
      uVar6 = uVar6 ^ puVar4[4];
      puVar4[10] = uVar6;
      puVar4[0xb] = uVar6 ^ uVar1;
      puVar4 = puVar4 + 6;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x20);
  }
  else if (iVar2 == 0xe) {
    lVar5 = 0;
    do {
      uVar1 = ctx->buf[lVar5 * 2 + 7];
      uVar6 = (uint)FSb[uVar1 & 0xff] << 0x18 ^ (uint)FSb[uVar1 >> 0x18] << 0x10 ^
              (uint)FSb[uVar1 >> 0x10 & 0xff] << 8 ^
              (uint)FSb[uVar1 >> 8 & 0xff] ^ *(uint *)((long)RCON + lVar5) ^ puVar4[lVar5 * 2];
      ctx->buf[lVar5 * 2 + 8] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 * 2 + 1];
      ctx->buf[lVar5 * 2 + 9] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 * 2 + 2];
      ctx->buf[lVar5 * 2 + 10] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 * 2 + 3];
      ctx->buf[lVar5 * 2 + 0xb] = uVar6;
      uVar6 = (uint)FSb[uVar6 >> 0x18] << 0x18 ^ (uint)FSb[uVar6 >> 0x10 & 0xff] << 0x10 ^
              (uint)FSb[uVar6 >> 8 & 0xff] << 8 ^ (uint)FSb[uVar6 & 0xff] ^ ctx->buf[lVar5 * 2 + 4];
      ctx->buf[lVar5 * 2 + 0xc] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 * 2 + 5];
      ctx->buf[lVar5 * 2 + 0xd] = uVar6;
      uVar6 = uVar6 ^ ctx->buf[lVar5 * 2 + 6];
      ctx->buf[lVar5 * 2 + 0xe] = uVar6;
      ctx->buf[lVar5 * 2 + 0xf] = uVar6 ^ uVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x1c);
  }
  return 0;
}

Assistant:

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
    uint32_t *RK;

    switch (keybits) {
        case 128: ctx->nr = 10; break;
#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
        default: return MBEDTLS_ERR_AES_INVALID_KEY_LENGTH;
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if (aes_init_done == 0) {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    for (unsigned int i = 0; i < (keybits >> 5); i++) {
        RK[i] = MBEDTLS_GET_UINT32_LE(key, i << 2);
    }

    switch (ctx->nr) {
        case 10:

            for (unsigned int i = 0; i < 10; i++, RK += 4) {
                RK[4]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[3])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[3])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[3])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[3])] << 24);

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 12:

            for (unsigned int i = 0; i < 8; i++, RK += 6) {
                RK[6]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[5])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[5])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[5])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[5])] << 24);

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for (unsigned int i = 0; i < 7; i++, RK += 8) {
                RK[8]  = RK[0] ^ RCON[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[7])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[7])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[7])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[7])] << 24);

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[11])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[11])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[11])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[11])] << 24);

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
    }

    return 0;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}